

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_manager.cpp
# Opt level: O3

uint32_t __thiscall
spvtools::opt::analysis::TypeManager::FindPointerToType
          (TypeManager *this,uint32_t type_id,StorageClass storage_class)

{
  uint32_t uVar1;
  StorageClass SVar2;
  Type *type;
  Instruction *pIVar3;
  pointer *__ptr;
  default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *this_00;
  Module *this_01;
  IRContext *pIVar4;
  long lVar5;
  size_type __dnew;
  string message;
  Pointer pointerTy;
  undefined1 local_138 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_118;
  undefined1 local_108 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_e8;
  size_t *local_e0;
  SmallVector<unsigned_int,_2UL> local_d8;
  undefined4 local_b0;
  undefined1 local_a8 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_88;
  Pointer local_80;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  type = GetType(this,type_id);
  Pointer::Pointer(&local_80,type,storage_class);
  pIVar4 = this->context_;
  this_01 = (pIVar4->module_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
            .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  pIVar3 = *(Instruction **)
            ((long)&(this_01->types_values_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10)
  ;
  do {
    if (pIVar3 == &(this_01->types_values_).super_IntrusiveList<spvtools::opt::Instruction>.
                   sentinel_) {
      uVar1 = Module::TakeNextIdBound(this_01);
      if ((uVar1 == 0) &&
         ((pIVar4->consumer_).super__Function_base._M_manager != (_Manager_type)0x0)) {
        local_138._0_8_ = (_func_int **)0x25;
        uVar1 = 0;
        local_e0 = &local_d8.size_;
        local_e0 = (size_t *)std::__cxx11::string::_M_create((ulong *)&local_e0,(ulong)local_138);
        local_d8.size_ = local_138._0_8_;
        *local_e0 = 0x667265766f204449;
        local_e0[1] = 0x797254202e776f6c;
        local_e0[2] = 0x676e696e6e757220;
        local_e0[3] = 0x746361706d6f6320;
        builtin_strncpy((char *)((long)local_e0 + 0x1d),"act-ids.",8);
        local_d8._vptr_SmallVector = (_func_int **)local_138._0_8_;
        *(char *)((long)local_e0 + local_138._0_8_) = '\0';
        local_138._0_8_ = (_func_int **)0x0;
        local_138._8_8_ = 0;
        local_138._16_4_ = (array<signed_char,_4UL>)0x0;
        local_138._20_4_ = (array<signed_char,_4UL>)0x0;
        std::
        function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
        operator()(&pIVar4->consumer_,SPV_MSG_ERROR,"",(spv_position_t *)local_138,(char *)local_e0)
        ;
        if (local_e0 != &local_d8.size_) {
          operator_delete(local_e0,local_d8.size_ + 1);
        }
      }
      else if (uVar1 == 0) {
LAB_0050b1f7:
        uVar1 = 0;
      }
      else {
        pIVar3 = (Instruction *)operator_new(0x70);
        pIVar4 = this->context_;
        local_138._24_8_ = local_138 + 0x10;
        local_138._0_8_ = &PTR__SmallVector_00b02ef8;
        local_118._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )0x0;
        local_138._16_4_ = storage_class;
        local_138._8_8_ = 1;
        local_e0 = (size_t *)CONCAT44(local_e0._4_4_,0x11);
        local_d8._vptr_SmallVector = (_func_int **)&PTR__SmallVector_00b02ef8;
        local_d8.size_ = 0;
        local_d8.small_data_ = (uint *)local_d8.buffer;
        local_d8.large_data_._M_t.
        super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                        )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )0x0;
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  (&local_d8,(SmallVector<unsigned_int,_2UL> *)local_138);
        local_108._24_8_ = local_108 + 0x10;
        local_108._0_8_ = &PTR__SmallVector_00b02ef8;
        local_e8._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )0x0;
        local_108._8_8_ = 1;
        local_b0 = 1;
        local_a8._0_8_ = &PTR__SmallVector_00b02ef8;
        local_a8._8_8_ = 0;
        local_a8._24_8_ = local_a8 + 0x10;
        this_00 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                  &local_88;
        local_88._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )0x0;
        local_108._16_4_ = type_id;
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  ((SmallVector<unsigned_int,_2UL> *)local_a8,
                   (SmallVector<unsigned_int,_2UL> *)local_108);
        local_48 = 0;
        uStack_40 = 0;
        local_38 = 0;
        std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
        _M_range_initialize<spvtools::opt::Operand_const*>
                  ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                   &local_48,&local_e0,&local_80);
        Instruction::Instruction(pIVar3,pIVar4,OpTypePointer,0,uVar1,(OperandList *)&local_48);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   &local_48);
        lVar5 = -0x60;
        do {
          *(undefined ***)(this_00 + -0x20) = &PTR__SmallVector_00b02ef8;
          if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_00 !=
              (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()(this_00,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_00);
          }
          *(undefined8 *)this_00 = 0;
          this_00 = this_00 + -0x30;
          lVar5 = lVar5 + 0x30;
        } while (lVar5 != 0);
        local_108._0_8_ = &PTR__SmallVector_00b02ef8;
        if (local_e8._M_t.
            super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            .
            super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
            ._M_head_impl !=
            (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_e8,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     local_e8._M_t.
                     super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     .
                     super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                     ._M_head_impl);
        }
        local_138._0_8_ = &PTR__SmallVector_00b02ef8;
        if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )local_118._M_t.
              super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              .
              super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
              ._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_118,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     local_118._M_t.
                     super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     .
                     super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                     ._M_head_impl);
        }
        pIVar4 = this->context_;
        utils::IntrusiveList<spvtools::opt::Instruction>::push_back
                  (&(((pIVar4->module_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                      .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                    types_values_).super_IntrusiveList<spvtools::opt::Instruction>,pIVar3);
        if ((pIVar4->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
          DefUseManager::AnalyzeInstDefUse
                    ((pIVar4->def_use_mgr_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                     _M_head_impl,
                     *(Instruction **)
                      ((long)&(((pIVar4->module_)._M_t.
                                super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                                .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)
                              ->types_values_).super_IntrusiveList<spvtools::opt::Instruction> +
                      0x18));
        }
        pIVar4 = this->context_;
        if ((pIVar4->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
          IRContext::BuildTypeManager(pIVar4);
        }
        RegisterType((pIVar4->type_mgr_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                     .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>.
                     _M_head_impl,uVar1,&local_80.super_Type);
      }
LAB_0050b1f9:
      local_80.super_Type._vptr_Type = (_func_int **)&PTR__Type_00b031e8;
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector(&local_80.super_Type.decorations_);
      return uVar1;
    }
    if (pIVar3->opcode_ == OpTypePointer) {
      uVar1 = Instruction::GetSingleWordOperand(pIVar3,2);
      if (uVar1 == type_id) {
        SVar2 = Instruction::GetSingleWordOperand(pIVar3,1);
        if (SVar2 == storage_class) {
          if (pIVar3->has_result_id_ != true) goto LAB_0050b1f7;
          uVar1 = Instruction::GetSingleWordOperand(pIVar3,(uint)pIVar3->has_type_id_);
          goto LAB_0050b1f9;
        }
      }
    }
    pIVar3 = (pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    pIVar4 = this->context_;
    this_01 = (pIVar4->module_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
              .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  } while( true );
}

Assistant:

uint32_t TypeManager::FindPointerToType(uint32_t type_id,
                                        spv::StorageClass storage_class) {
  Type* pointeeTy = GetType(type_id);
  Pointer pointerTy(pointeeTy, storage_class);

  Module::inst_iterator type_itr = context()->module()->types_values_begin();
  for (; type_itr != context()->module()->types_values_end(); ++type_itr) {
    const Instruction* type_inst = &*type_itr;
    if (type_inst->opcode() == spv::Op::OpTypePointer &&
        type_inst->GetSingleWordOperand(kSpvTypePointerTypeIdInIdx) ==
            type_id &&
        spv::StorageClass(type_inst->GetSingleWordOperand(
            kSpvTypePointerStorageClass)) == storage_class)
      return type_inst->result_id();
  }

  // Must create the pointer type.
  uint32_t resultId = context()->TakeNextId();
  if (resultId == 0) {
    return 0;
  }
  std::unique_ptr<Instruction> type_inst(
      new Instruction(context(), spv::Op::OpTypePointer, 0, resultId,
                      {{spv_operand_type_t::SPV_OPERAND_TYPE_STORAGE_CLASS,
                        {uint32_t(storage_class)}},
                       {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {type_id}}}));
  context()->AddType(std::move(type_inst));
  context()->get_type_mgr()->RegisterType(resultId, pointerTy);
  return resultId;
}